

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

self * __thiscall
boost::python::
class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
add_property<std::vector<int,std::allocator<int>>HFParsingInfo::*,std::vector<int,std::allocator<int>>HFParsingInfo::*>
          (class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fget,
          offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fset,char *docstr)

{
  offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> pm;
  vector2<std::vector<int,_std::allocator<int>_>_&,_HFParsingInfo_&> local_32;
  vector3<void,_HFParsingInfo_&,_const_std::vector<int,_std::allocator<int>_>_&> local_31;
  object_base local_30;
  object_base local_28;
  
  detail::
  make_function_aux<boost::python::detail::member<std::vector<int,std::allocator<int>>,HFParsingInfo>,boost::python::return_internal_reference<1ul,boost::python::default_call_policies>,boost::mpl::vector2<std::vector<int,std::allocator<int>>&,HFParsingInfo&>>
            ((member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>)&local_28,
             (return_internal_reference<1UL,_boost::python::default_call_policies> *)fget,&local_32)
  ;
  detail::
  make_function_aux<boost::python::detail::member<std::vector<int,std::allocator<int>>,HFParsingInfo>,boost::python::default_call_policies,boost::mpl::vector3<void,HFParsingInfo&,std::vector<int,std::allocator<int>>const&>>
            ((member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>)&local_30,
             (default_call_policies *)fset,&local_31);
  objects::class_base::add_property
            ((class_base *)this,name,(object *)&local_28,(object *)&local_30,docstr);
  (local_30.m_ptr)->ob_refcnt = (local_30.m_ptr)->ob_refcnt + -1;
  if ((local_30.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  (local_28.m_ptr)->ob_refcnt = (local_28.m_ptr)->ob_refcnt + -1;
  if ((local_28.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  return (self *)this;
}

Assistant:

self& add_property(char const* name, Get fget, Set fset, char const* docstr = 0)
    {
        base::add_property(
            name, this->make_getter(fget), this->make_setter(fset), docstr);
        return *this;
    }